

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TIntermediate::addSwizzle<glslang::TMatrixSelector>
          (TIntermediate *this,TSwizzleSelectors<glslang::TMatrixSelector> *selector,TSourceLoc *loc
          )

{
  TMatrixSelector in_RAX;
  TPoolAllocator *this_00;
  TIntermediate *this_01;
  TIntermSequence *sequence;
  long lVar1;
  TIntermediate *this_02;
  TMatrixSelector local_38;
  
  local_38 = in_RAX;
  this_00 = GetThreadPoolAllocator();
  this_01 = (TIntermediate *)TPoolAllocator::allocate(this_00,0x188);
  TIntermAggregate::TIntermAggregate((TIntermAggregate *)this_01,EOpSequence);
  (**(code **)(*(long *)this_01 + 8))(this_01,loc);
  this_02 = this_01;
  sequence = (TIntermSequence *)(**(code **)(*(long *)this_01 + 400))();
  if (0 < selector->size_) {
    lVar1 = 0;
    do {
      if (lVar1 == 4) {
        __assert_fail("i < MaxSwizzleSelectors",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/localintermediate.h"
                      ,0x54,
                      "selectorType glslang::TSwizzleSelectors<glslang::TMatrixSelector>::operator[](int) const [selectorType = glslang::TMatrixSelector]"
                     );
      }
      local_38 = selector->components[lVar1];
      pushSelector(this_02,sequence,&local_38,loc);
      lVar1 = lVar1 + 1;
    } while (lVar1 < selector->size_);
  }
  return (TIntermTyped *)this_01;
}

Assistant:

TIntermTyped* TIntermediate::addSwizzle(TSwizzleSelectors<selectorType>& selector, const TSourceLoc& loc)
{
    TIntermAggregate* node = new TIntermAggregate(EOpSequence);

    node->setLoc(loc);
    TIntermSequence &sequenceVector = node->getSequence();

    for (int i = 0; i < selector.size(); i++)
        pushSelector(sequenceVector, selector[i], loc);

    return node;
}